

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O3

CURLcode cr_buf_resume_from(Curl_easy *data,Curl_creader *reader,curl_off_t offset)

{
  void *pvVar1;
  
  pvVar1 = reader->ctx;
  if (*(long *)((long)pvVar1 + 0x30) != 0) {
    return CURLE_READ_ERROR;
  }
  if (0 < offset) {
    if (*(ulong *)((long)pvVar1 + 0x28) < (ulong)offset) {
      return CURLE_READ_ERROR;
    }
    *(long *)((long)pvVar1 + 0x20) = *(long *)((long)pvVar1 + 0x20) + offset;
    *(ulong *)((long)pvVar1 + 0x28) = *(ulong *)((long)pvVar1 + 0x28) - offset;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode cr_buf_resume_from(struct Curl_easy *data,
                                   struct Curl_creader *reader,
                                   curl_off_t offset)
{
  struct cr_buf_ctx *ctx = reader->ctx;
  size_t boffset;

  (void)data;
  DEBUGASSERT(data->conn);
  /* already started reading? */
  if(ctx->index)
    return CURLE_READ_ERROR;
  if(offset <= 0)
    return CURLE_OK;
  boffset = (size_t)offset;
  if(boffset > ctx->blen)
    return CURLE_READ_ERROR;

  ctx->buf += boffset;
  ctx->blen -= boffset;
  return CURLE_OK;
}